

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O2

ssize_t __thiscall amrex::FluxRegister::write(FluxRegister *this,int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  ssize_t sVar2;
  undefined4 *__n_00;
  
  __n_00 = &ParallelDescriptor::ioProcessor;
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    poVar1 = amrex::operator<<((ostream *)__buf,&this->ratio);
    std::operator<<(poVar1,'\n');
    poVar1 = (ostream *)std::ostream::operator<<(__buf,this->fine_level);
    std::operator<<(poVar1,'\n');
    poVar1 = (ostream *)std::ostream::operator<<(__buf,this->ncomp);
    std::operator<<(poVar1,'\n');
  }
  sVar2 = BndryRegister::write(&this->super_BndryRegister,__fd,__buf,(size_t)__n_00);
  return sVar2;
}

Assistant:

void
FluxRegister::write (const std::string& name, std::ostream& os) const
{
    if (ParallelDescriptor::IOProcessor())
    {
        os << ratio      << '\n';
        os << fine_level << '\n';
        os << ncomp      << '\n';
    }

    const BndryRegister* br = this;

    br->write(name,os);
}